

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::str<bool&>(String *__return_storage_ptr__,kj *this,bool *params)

{
  bool *value;
  ArrayPtr<const_char> local_28;
  kj *local_18;
  bool *params_local;
  
  local_18 = this;
  params_local = (bool *)__return_storage_ptr__;
  value = fwd<bool&>((bool *)this);
  local_28 = (ArrayPtr<const_char>)toCharSequence<bool&>(value);
  _::concat<kj::StringPtr>(__return_storage_ptr__,(StringPtr *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}